

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void embree::storeImage(Ref<embree::Image> *img,FileName *fileName)

{
  bool bVar1;
  runtime_error *this;
  string ext;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  FileName::ext_abi_cxx11_(&local_60,fileName);
  toLowerCase(&ext,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator==(&ext,"bmp");
  if (!bVar1) {
    bVar1 = std::operator==(&ext,"png");
    if (!bVar1) {
      bVar1 = std::operator==(&ext,"jpg");
      if (!bVar1) {
        bVar1 = std::operator==(&ext,"exr");
        if (bVar1) {
          storeEXR(img,fileName);
        }
        else {
          bVar1 = std::operator==(&ext,"pfm");
          if (bVar1) {
            storePFM(img,fileName);
          }
          else {
            bVar1 = std::operator==(&ext,"ppm");
            if (bVar1) {
              storePPM(img,fileName);
            }
            else {
              bVar1 = std::operator==(&ext,"tga");
              if (!bVar1) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_40,"image format ",&ext);
                std::operator+(&local_60,&local_40," not supported");
                std::runtime_error::runtime_error(this,(string *)&local_60);
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              storeTga(img,fileName);
            }
          }
        }
        goto LAB_00198c9c;
      }
    }
  }
  storeSTB(img,fileName);
LAB_00198c9c:
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

void storeImage(const Ref<Image>& img, const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());

    if (ext == "bmp" ) { storeSTB(img, fileName);  return; }
    if (ext == "png" ) { storeSTB(img, fileName);  return; }
    if (ext == "jpg" ) { storeSTB(img, fileName);  return; }

    if (ext == "exr" ) { storeEXR(img, fileName);  return; }

    if (ext == "pfm" ) { storePFM(img, fileName);  return; }
    if (ext == "ppm" ) { storePPM(img, fileName);  return; }
    if (ext == "tga" ) { storeTga(img, fileName);  return; }
    THROW_RUNTIME_ERROR("image format " + ext + " not supported");
  }